

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          int num_digits,string_view prefix,basic_format_specs<char> *spec,hex_writer f)

{
  type tVar1;
  wchar_t wVar2;
  alignment aVar3;
  uint uVar4;
  size_t sVar5;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  local_90;
  undefined1 local_54 [8];
  align_spec as;
  size_t padding;
  ulong uStack_38;
  char_type fill;
  size_t size;
  basic_format_specs<char> *spec_local;
  int num_digits_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  string_view prefix_local;
  
  prefix_local.data_ = (char *)prefix.size_;
  this_local = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
               prefix.data_;
  sVar5 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  tVar1 = internal::to_unsigned<int>(num_digits);
  uStack_38 = sVar5 + tVar1;
  wVar2 = align_spec::fill(&spec->super_align_spec);
  padding._7_1_ = (char_type)wVar2;
  as.fill_ = L'\0';
  as.align_ = ALIGN_DEFAULT;
  aVar3 = align_spec::align(&spec->super_align_spec);
  if (aVar3 == ALIGN_NUMERIC) {
    uVar4 = align_spec::width(&spec->super_align_spec);
    if (uStack_38 < uVar4) {
      uVar4 = align_spec::width(&spec->super_align_spec);
      as._4_8_ = uVar4 - uStack_38;
      uVar4 = align_spec::width(&spec->super_align_spec);
      uStack_38 = (ulong)uVar4;
    }
  }
  else if (num_digits < (spec->super_core_format_specs).precision) {
    sVar5 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
    tVar1 = internal::to_unsigned<int>((spec->super_core_format_specs).precision);
    uStack_38 = sVar5 + tVar1;
    tVar1 = internal::to_unsigned<int>((spec->super_core_format_specs).precision - num_digits);
    as._4_8_ = ZEXT48(tVar1);
    padding._7_1_ = '0';
  }
  local_54._0_4_ = (spec->super_align_spec).width_;
  local_54._4_4_ = (spec->super_align_spec).fill_;
  as.width_ = (spec->super_align_spec).align_;
  aVar3 = align_spec::align(&spec->super_align_spec);
  if (aVar3 == ALIGN_DEFAULT) {
    as.width_ = 2;
  }
  local_90.size_ = uStack_38;
  local_90.prefix.data_ = (char *)this_local;
  local_90.prefix.size_ = (size_t)prefix_local.data_;
  local_90.fill = padding._7_1_;
  local_90.padding._0_4_ = as.fill_;
  local_90.padding._4_4_ = as.align_;
  local_90.f.self = f.self;
  local_90.f.num_digits = f.num_digits;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>>
            (this,(align_spec *)local_54,&local_90);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }